

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QSqlField *f)

{
  QMetaTypeInterface *pQVar1;
  PrivateShared *pPVar2;
  char cVar3;
  QDebug *pQVar4;
  QSqlFieldPrivate *pQVar5;
  QVariant *variant;
  QSqlField *in_RDX;
  char *pcVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QDebugStateSaver saver;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)f);
  (f->val).d.data.shared[0x30] = (PrivateShared)0x0;
  pQVar4 = QDebug::operator<<((QDebug *)f,"QSqlField(");
  QSqlField::name((QString *)local_58,in_RDX);
  pQVar4 = QDebug::operator<<(pQVar4,(QString *)local_58);
  pQVar4 = QDebug::operator<<(pQVar4,", ");
  pQVar1 = (((in_RDX->d).d.ptr)->type).d_ptr;
  if (pQVar1 == (QMetaTypeInterface *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = pQVar1->name;
  }
  QDebug::operator<<(pQVar4,pcVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  pQVar4 = QDebug::operator<<((QDebug *)f,", tableName: ");
  QSqlField::tableName((QString *)&local_78,in_RDX);
  if (local_78.size == 0) {
    local_58._0_8_ = (PrivateShared *)0x0;
    local_90.d = (Data *)0x0;
    local_90.ptr = (char16_t *)0x0;
    local_58._8_8_ = L"(not specified)";
    local_90.size = 0;
    local_58._16_8_ = 0xf;
  }
  else {
    QSqlField::tableName((QString *)local_58,in_RDX);
  }
  QDebug::operator<<(pQVar4,(QString *)local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  if (local_78.size == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  pQVar5 = (in_RDX->d).d.ptr;
  if (-1 < pQVar5->len) {
    pQVar4 = QDebug::operator<<((QDebug *)f,", length: ");
    QDebug::operator<<(pQVar4,((in_RDX->d).d.ptr)->len);
    pQVar5 = (in_RDX->d).d.ptr;
  }
  if (-1 < pQVar5->prec) {
    pQVar4 = QDebug::operator<<((QDebug *)f,", precision: ");
    QDebug::operator<<(pQVar4,((in_RDX->d).d.ptr)->prec);
    pQVar5 = (in_RDX->d).d.ptr;
  }
  if (pQVar5->req != Unknown) {
    pQVar4 = QDebug::operator<<((QDebug *)f,", required: ");
    pcVar6 = "no";
    if (((in_RDX->d).d.ptr)->req == Required) {
      pcVar6 = "yes";
    }
    QDebug::operator<<(pQVar4,pcVar6);
  }
  pQVar4 = QDebug::operator<<((QDebug *)f,", generated: ");
  pcVar6 = "yes";
  if ((((in_RDX->d).d.ptr)->field_0x70 & 2) == 0) {
    pcVar6 = "no";
  }
  QDebug::operator<<(pQVar4,pcVar6);
  QSqlField::defaultValue((QVariant *)local_58,in_RDX);
  cVar3 = QVariant::isNull();
  QVariant::~QVariant((QVariant *)local_58);
  if (cVar3 == '\0') {
    variant = (QVariant *)QDebug::operator<<((QDebug *)f,", defaultValue: \"");
    QSqlField::defaultValue((QVariant *)local_58,in_RDX);
    operator<<((QDebug *)&local_78,variant);
    QDebug::operator<<((QDebug *)&local_78,'\"');
    QDebug::~QDebug((QDebug *)&local_78);
    QVariant::~QVariant((QVariant *)local_58);
  }
  pQVar4 = QDebug::operator<<((QDebug *)f,", autoValue: ");
  pQVar4 = QDebug::operator<<(pQVar4,(bool)((((in_RDX->d).d.ptr)->field_0x70 & 4) >> 2));
  pQVar4 = QDebug::operator<<(pQVar4,", readOnly: ");
  pQVar4 = QDebug::operator<<(pQVar4,(bool)(((in_RDX->d).d.ptr)->field_0x70 & 1));
  QDebug::operator<<(pQVar4,')');
  pPVar2 = (f->val).d.data.shared;
  (f->val).d.data.shared = (PrivateShared *)0x0;
  *(PrivateShared **)dbg.stream = pPVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QSqlField &f)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QSqlField(" << f.name() << ", " << f.metaType().name();
    dbg << ", tableName: " << (f.tableName().isEmpty() ? QStringLiteral("(not specified)") : f.tableName());
    if (f.length() >= 0)
        dbg << ", length: " << f.length();
    if (f.precision() >= 0)
        dbg << ", precision: " << f.precision();
    if (f.requiredStatus() != QSqlField::Unknown)
        dbg << ", required: "
            << (f.requiredStatus() == QSqlField::Required ? "yes" : "no");
    dbg  << ", generated: " << (f.isGenerated() ? "yes" : "no");
    if (!f.defaultValue().isNull())
        dbg << ", defaultValue: \"" << f.defaultValue() << '\"';
    dbg << ", autoValue: " << f.isAutoValue()
        << ", readOnly: " << f.isReadOnly() << ')';
    return dbg;
}